

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

int __thiscall
ft::list<int,_ft::allocator<int>_>::remove(list<int,_ft::allocator<int>_> *this,char *__filename)

{
  bool bVar1;
  int extraout_EAX;
  reference pvVar2;
  listIterator<int> local_68;
  list<int,_ft::allocator<int>_> local_58;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  iterator it;
  value_type_conflict *val_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  it.m_node = (Node *)__filename;
  begin((list<int,_ft::allocator<int>_> *)local_28);
  while( true ) {
    end((list<int,_ft::allocator<int>_> *)local_38);
    bVar1 = operator!=((listIterator<int> *)local_28,(listIterator<int> *)local_38);
    listIterator<int>::~listIterator((listIterator<int> *)local_38);
    if (!bVar1) break;
    pvVar2 = listIterator<int>::operator*((listIterator<int> *)local_28);
    if (*pvVar2 == (it.m_node)->data) {
      listIterator<int>::listIterator(&local_68,(listIterator<int> *)local_28);
      erase(&local_58,(iterator *)this);
      listIterator<int>::operator=((listIterator<int> *)local_28,(listIterator<int> *)&local_58);
      listIterator<int>::~listIterator((listIterator<int> *)&local_58);
      listIterator<int>::~listIterator(&local_68);
    }
    else {
      listIterator<int>::operator++((listIterator<int> *)local_28);
    }
  }
  listIterator<int>::~listIterator((listIterator<int> *)local_28);
  return extraout_EAX;
}

Assistant:

void remove(value_type const & val) {
		iterator	it = this->begin();
		while (it != this->end()) {
			if (*it == val)
				it = this->erase(it);
			else
				++it;
		}
	}